

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::PrintValue<pstore::gsl::span<int,_1l>,void>
               (span<int,__1L> *container,ostream *os)

{
  reference value;
  long lVar1;
  iterator __end0;
  iterator __begin0;
  
  std::operator<<(os,'{');
  pstore::gsl::span<int,_-1L>::begin((span<int,__1L> *)&__begin0);
  pstore::gsl::span<int,_-1L>::end((span<int,__1L> *)&__end0);
  lVar1 = 0;
  while( true ) {
    if ((__begin0.span_ == __end0.span_) && (__begin0.index_ == __end0.index_)) {
      if (lVar1 == 0) goto LAB_0012b49e;
      goto LAB_0012b493;
    }
    value = pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::operator*
                      (&__begin0);
    if ((lVar1 != 0) && (std::operator<<(os,','), lVar1 == 0x20)) break;
    std::operator<<(os,' ');
    internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
    PrintValue<int,void,std::ostream&>(value,os);
    lVar1 = lVar1 + 1;
    pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::operator++(&__begin0);
  }
  std::operator<<(os," ...");
LAB_0012b493:
  std::operator<<(os,' ');
LAB_0012b49e:
  std::operator<<(os,'}');
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }